

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O0

void __thiscall
diy::detail::
AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>::
operator()(AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
           *this,Block *b,ReduceProxy *srp,RegularSwapPartners *param_4)

{
  bool bVar1;
  reference pvVar2;
  MemoryBuffer *pMVar3;
  Link *this_00;
  ReduceProxy *in_RDX;
  long in_RDI;
  MemoryBuffer *out_1;
  int j_2;
  pair<int,_int> from_to_2;
  MemoryBuffer *in_2;
  int i_4;
  pair<int,_int> out_range;
  MemoryBuffer *out;
  int i_3;
  int group_1;
  int j_1;
  size_t s;
  pair<int,_int> from_to_1;
  int group_2;
  MemoryBuffer *in_1;
  int i_2;
  pair<int,_int> range_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes_out;
  pair<int,_int> from_to;
  MemoryBuffer *in;
  int gid_in;
  int i_1;
  pair<int,_int> range_1;
  IncomingQueues all_incoming;
  ReduceProxy all_srp_2;
  int to;
  int from;
  int j;
  pair<int,_int> range;
  int i;
  int group;
  OutgoingQueues all_queues;
  ReduceProxy all_srp_1;
  Link *out_link;
  Link *in_link;
  MemoryBuffer *in_queue;
  ReduceProxy all_srp;
  int k_out;
  int k_in;
  Link *in_stack_fffffffffffff9f8;
  ReduceProxy *in_stack_fffffffffffffa00;
  BlockID *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  Link *in_stack_fffffffffffffa18;
  Assigner *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  uint round;
  void *in_stack_fffffffffffffa30;
  Proxy *in_stack_fffffffffffffa38;
  ReduceProxy *in_stack_fffffffffffffa40;
  size_t sVar4;
  Link *in_stack_fffffffffffffa50;
  ReduceProxy *in_stack_fffffffffffffa60;
  Block<float> *in_stack_fffffffffffffa68;
  MemoryBuffer *in_stack_fffffffffffffa70;
  pair<int,_int> local_498;
  BlockID local_490;
  MemoryBuffer *local_488;
  int local_47c;
  pair<int,_int> local_478;
  BlockID local_470;
  MemoryBuffer *local_468;
  int local_45c;
  int local_458;
  int local_454;
  size_t local_450;
  pair<int,_int> local_444;
  int local_43c;
  BlockID local_438;
  MemoryBuffer *local_430;
  int local_428;
  pair<int,_int> local_424;
  undefined8 local_418;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_410;
  pair<int,_int> local_3f8;
  mapped_type *local_3f0;
  BlockID local_3e8;
  int local_3e0;
  int local_3dc;
  pair<int,_int> local_3d8 [7];
  Proxy local_3a0;
  BlockID local_2b4;
  BlockID local_2ac;
  pair<int,_int> local_2a4;
  BlockID local_29c;
  BlockID local_294;
  int local_28c;
  int local_288;
  int local_284;
  BlockID local_280;
  int local_278;
  int local_274;
  pair<int,_int> local_270;
  int local_268;
  int local_264;
  ReduceProxy local_230;
  Link *local_148;
  Link *local_140;
  BlockID local_138;
  BlockID local_130;
  MemoryBuffer *local_128;
  ReduceProxy local_110;
  int local_28;
  int local_24;
  ReduceProxy *local_18;
  
  round = (uint)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  local_18 = in_RDX;
  ReduceProxy::in_link(in_RDX);
  local_24 = Link::size((Link *)0x1a9e4c);
  ReduceProxy::out_link(local_18);
  local_28 = Link::size((Link *)0x1a9e68);
  if ((local_24 == 0) && (local_28 == 0)) {
    ReduceProxy::block(local_18);
    ReduceProxy::assigner(local_18);
    pMVar3 = (MemoryBuffer *)(in_RDI + 8);
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,round,
               in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa50);
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              ((Exchanger *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               in_stack_fffffffffffffa60);
    ReduceProxy::out_link(&local_110);
    local_130 = Link::target((Link *)pMVar3,0);
    local_128 = Master::Proxy::incoming
                          (&in_stack_fffffffffffffa00->super_Proxy,(int)((ulong)pMVar3 >> 0x20));
    ReduceProxy::out_link(&local_110);
    local_138 = Link::target((Link *)pMVar3,0);
    Master::Proxy::outgoing(&in_stack_fffffffffffffa00->super_Proxy,(BlockID *)pMVar3);
    MemoryBuffer::swap((MemoryBuffer *)in_stack_fffffffffffffa00,pMVar3);
    MemoryBuffer::reset(local_128);
    Master::Proxy::outgoing(&local_110.super_Proxy);
    std::
    map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::clear((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             *)0x1aa004);
    ReduceProxy::set_round(&local_110,1);
    local_140 = ReduceProxy::in_link(&local_110);
    local_148 = ReduceProxy::out_link(&local_110);
    Link::swap((Link *)in_stack_fffffffffffffa00,(Link *)pMVar3);
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              ((Exchanger *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               in_stack_fffffffffffffa60);
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffa00);
  }
  else if (local_24 == 0) {
    ReduceProxy::block(local_18);
    ReduceProxy::assigner(local_18);
    this_00 = (Link *)(in_RDI + 8);
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,round,
               in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa50);
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              ((Exchanger *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               in_stack_fffffffffffffa60);
    std::
    map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::map((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
           *)0x1aa165);
    Master::Proxy::outgoing(&local_230.super_Proxy);
    std::
    map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::swap((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            *)in_stack_fffffffffffffa00,
           (map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            *)this_00);
    ReduceProxy::out_link(&local_230);
    local_264 = Link::size((Link *)0x1aa197);
    local_264 = local_264 / local_28;
    for (local_268 = 0; local_268 < local_28; local_268 = local_268 + 1) {
      local_274 = local_268 * local_264;
      local_278 = (local_268 + 1) * local_264;
      std::pair<int,_int>::pair<int,_int,_true>(&local_270,&local_274,&local_278);
      ReduceProxy::out_link(local_18);
      local_280 = Link::target(this_00,0);
      Master::Proxy::enqueue<std::pair<int,int>>
                ((Proxy *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08,(pair<int,_int> *)in_stack_fffffffffffffa00,
                 (_func_void_BinaryBuffer_ptr_pair<int,_int>_ptr *)this_00);
      for (local_284 = local_268 * local_264; local_284 < (local_268 + 1) * local_264;
          local_284 = local_284 + 1) {
        local_288 = Master::Proxy::gid(&local_18->super_Proxy);
        ReduceProxy::out_link(&local_230);
        local_294 = Link::target(this_00,0);
        local_28c = local_294.gid;
        ReduceProxy::out_link(local_18);
        local_29c = Link::target(this_00,0);
        local_2a4 = std::make_pair<int&,int&>((int *)this_00,(int *)0x1aa326);
        Master::Proxy::enqueue<std::pair<int,int>>
                  ((Proxy *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                   in_stack_fffffffffffffa08,(pair<int,_int> *)in_stack_fffffffffffffa00,
                   (_func_void_BinaryBuffer_ptr_pair<int,_int>_ptr *)this_00);
        ReduceProxy::out_link(local_18);
        local_2ac = Link::target(this_00,0);
        ReduceProxy::out_link(&local_230);
        local_2b4 = Link::target(this_00,0);
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)in_stack_fffffffffffffa40,(key_type *)in_stack_fffffffffffffa38);
        Master::Proxy::enqueue<diy::MemoryBuffer>
                  ((Proxy *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                   in_stack_fffffffffffffa08,(MemoryBuffer *)in_stack_fffffffffffffa00,
                   (_func_void_BinaryBuffer_ptr_MemoryBuffer_ptr *)this_00);
      }
    }
    std::
    map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::~map((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            *)0x1aa471);
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffa00);
  }
  else if (local_28 == 0) {
    ReduceProxy::block(local_18);
    ReduceProxy::assigner(local_18);
    pMVar3 = (MemoryBuffer *)(in_RDI + 0x28);
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,round,
               in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa50);
    std::
    map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
    ::map((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
           *)0x1aa520);
    Master::Proxy::incoming(&local_3a0);
    std::
    map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
    ::swap((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
            *)in_stack_fffffffffffffa00,
           (map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
            *)pMVar3);
    std::pair<int,_int>::pair<int,_int,_true>(local_3d8);
    for (local_3dc = 0; local_3dc < local_24; local_3dc = local_3dc + 1) {
      ReduceProxy::in_link(local_18);
      local_3e8 = Link::target((Link *)pMVar3,0);
      local_3e0 = local_3e8.gid;
      local_3f0 = std::
                  map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                  ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                *)in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->gid_);
      load<std::pair<int,int>>((BinaryBuffer *)in_stack_fffffffffffffa00,(pair<int,_int> *)pMVar3);
      while (bVar1 = MemoryBuffer::operator_cast_to_bool((MemoryBuffer *)in_stack_fffffffffffffa00),
            bVar1) {
        std::pair<int,_int>::pair<int,_int,_true>(&local_3f8);
        load<std::pair<int,int>>((BinaryBuffer *)in_stack_fffffffffffffa00,(pair<int,_int> *)pMVar3)
        ;
        Master::Proxy::incoming
                  (&in_stack_fffffffffffffa00->super_Proxy,(int)((ulong)pMVar3 >> 0x20));
        load<diy::MemoryBuffer>((BinaryBuffer *)in_stack_fffffffffffffa00,pMVar3);
        in_stack_fffffffffffffa70 =
             Master::Proxy::incoming
                       (&in_stack_fffffffffffffa00->super_Proxy,(int)((ulong)pMVar3 >> 0x20));
        MemoryBuffer::reset(in_stack_fffffffffffffa70);
      }
    }
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              ((Exchanger *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               in_stack_fffffffffffffa60);
    std::
    map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
    ::~map((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
            *)0x1aa729);
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffa00);
  }
  else {
    local_418 = 8;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1aa766);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa20,
               (size_type)in_stack_fffffffffffffa18,
               (value_type_conflict5 *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10)
               ,(allocator_type *)in_stack_fffffffffffffa08);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1aa794);
    std::pair<int,_int>::pair<int,_int,_true>(&local_424);
    for (local_428 = 0; local_428 < local_24; local_428 = local_428 + 1) {
      ReduceProxy::in_link(local_18);
      local_438 = Link::target(in_stack_fffffffffffff9f8,0);
      local_430 = Master::Proxy::incoming
                            (&in_stack_fffffffffffffa00->super_Proxy,
                             (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      load<std::pair<int,int>>
                ((BinaryBuffer *)in_stack_fffffffffffffa00,
                 (pair<int,_int> *)in_stack_fffffffffffff9f8);
      local_43c = (local_424.second - local_424.first) / local_28;
      std::pair<int,_int>::pair<int,_int,_true>(&local_444);
      while (bVar1 = MemoryBuffer::operator_cast_to_bool((MemoryBuffer *)in_stack_fffffffffffffa00),
            bVar1) {
        load<std::pair<int,int>>
                  ((BinaryBuffer *)in_stack_fffffffffffffa00,
                   (pair<int,_int> *)in_stack_fffffffffffff9f8);
        load<unsigned_long>((BinaryBuffer *)in_stack_fffffffffffffa00,
                            (unsigned_long *)in_stack_fffffffffffff9f8);
        local_454 = (local_444.second - local_424.first) / local_43c;
        sVar4 = local_450;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_410,(long)local_454);
        *pvVar2 = sVar4 + 0x10 + *pvVar2;
        MemoryBuffer::skip(local_430,local_450);
      }
      MemoryBuffer::reset(local_430);
    }
    local_458 = (local_424.second - local_424.first) / local_28;
    for (local_45c = 0; local_45c < local_28; local_45c = local_45c + 1) {
      ReduceProxy::out_link(local_18);
      local_470 = Link::target(in_stack_fffffffffffff9f8,0);
      local_468 = Master::Proxy::outgoing
                            (&in_stack_fffffffffffffa00->super_Proxy,
                             (BlockID *)in_stack_fffffffffffff9f8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&local_410,(long)local_45c);
      MemoryBuffer::reserve
                ((MemoryBuffer *)in_stack_fffffffffffffa00,(size_t)in_stack_fffffffffffff9f8);
      std::pair<int,_int>::pair<int,_int,_true>(&local_478);
      local_478.first = local_424.first + local_458 * local_45c;
      local_478.second = local_424.first + local_458 * (local_45c + 1);
      save<std::pair<int,int>>
                ((BinaryBuffer *)in_stack_fffffffffffffa00,
                 (pair<int,_int> *)in_stack_fffffffffffff9f8);
    }
    for (local_47c = 0; local_47c < local_24; local_47c = local_47c + 1) {
      ReduceProxy::in_link(local_18);
      local_490 = Link::target(in_stack_fffffffffffff9f8,0);
      local_488 = Master::Proxy::incoming
                            (&in_stack_fffffffffffffa00->super_Proxy,
                             (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      load<std::pair<int,int>>
                ((BinaryBuffer *)in_stack_fffffffffffffa00,
                 (pair<int,_int> *)in_stack_fffffffffffff9f8);
      std::pair<int,_int>::pair<int,_int,_true>(&local_498);
      while (in_stack_fffffffffffffa17 =
                  MemoryBuffer::operator_cast_to_bool((MemoryBuffer *)in_stack_fffffffffffffa00),
            (bool)in_stack_fffffffffffffa17) {
        load<std::pair<int,int>>
                  ((BinaryBuffer *)in_stack_fffffffffffffa00,
                   (pair<int,_int> *)in_stack_fffffffffffff9f8);
        in_stack_fffffffffffffa00 = local_18;
        ReduceProxy::out_link(local_18);
        Link::target(in_stack_fffffffffffff9f8,0);
        pMVar3 = Master::Proxy::outgoing
                           (&in_stack_fffffffffffffa00->super_Proxy,
                            (BlockID *)in_stack_fffffffffffff9f8);
        save<std::pair<int,int>>
                  ((BinaryBuffer *)in_stack_fffffffffffffa00,
                   (pair<int,_int> *)in_stack_fffffffffffff9f8);
        MemoryBuffer::copy((EVP_PKEY_CTX *)local_488,(EVP_PKEY_CTX *)pMVar3);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  }
  return;
}

Assistant:

void operator()(Block* b, const ReduceProxy& srp, const RegularSwapPartners&) const
    {
      int k_in  = srp.in_link().size();
      int k_out = srp.out_link().size();

      if (k_in == 0 && k_out == 0)  // special case of a single block
      {
          ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);

          op(b, all_srp);

          MemoryBuffer& in_queue = all_srp.incoming(all_srp.out_link().target(0).gid);
          in_queue.swap(all_srp.outgoing(all_srp.out_link().target(0)));
          in_queue.reset();
          all_srp.outgoing()->clear();

          // change to incoming proxy
          all_srp.set_round(1);
          auto& in_link  = const_cast<Link&>(all_srp.in_link());
          auto& out_link = const_cast<Link&>(all_srp.out_link());
          in_link.swap(out_link);

          op(b, all_srp);
          return;
      }

      if (k_in == 0)                // initial round
      {
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);
        op(b, all_srp);

        Master::Proxy::OutgoingQueues all_queues;
        all_queues.swap(*all_srp.outgoing());       // clears out the queues and stores them locally

        // enqueue outgoing
        int group = all_srp.out_link().size() / k_out;
        for (int i = 0; i < k_out; ++i)
        {
          std::pair<int,int> range(i*group, (i+1)*group);
          srp.enqueue(srp.out_link().target(i), range);
          for (int j = i*group; j < (i+1)*group; ++j)
          {
            int from = srp.gid();
            int to   = all_srp.out_link().target(j).gid;
            srp.enqueue(srp.out_link().target(i), std::make_pair(from, to));
            srp.enqueue(srp.out_link().target(i), all_queues[all_srp.out_link().target(j)]);
          }
        }
      } else if (k_out == 0)        // final round
      {
        // dequeue incoming + reorder into the correct order
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 1, srp.assigner(), all_neighbors_link, empty_link);

        Master::Proxy::IncomingQueues all_incoming;
        all_incoming.swap(*all_srp.incoming());

        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          int gid_in = srp.in_link().target(i).gid;
          MemoryBuffer& in = all_incoming[gid_in];
          load(in, range);
          while(in)
          {
            std::pair<int, int> from_to;
            load(in, from_to);
            load(in, all_srp.incoming(from_to.first));
            all_srp.incoming(from_to.first).reset();
          }
        }

        op(b, all_srp);
      } else                                        // intermediate round: reshuffle queues
      {
        // add up buffer sizes
        std::vector<size_t> sizes_out(k_out, sizeof(std::pair<int,int>));
        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);
          int group = (range.second - range.first)/k_out;

          std::pair<int, int> from_to;
          size_t s;
          while(in)
          {
            diy::load(in, from_to);
            diy::load(in, s);

            int j = (from_to.second - range.first) / group;
            sizes_out[j] += s + sizeof(size_t) + sizeof(std::pair<int,int>);
            in.skip(s);
          }
          in.reset();
        }

        // reserve outgoing buffers of correct size
        int group = (range.second - range.first)/k_out;
        for (int i = 0; i < k_out; ++i)
        {
          MemoryBuffer& out = srp.outgoing(srp.out_link().target(i));
          out.reserve(sizes_out[i]);

          std::pair<int, int> out_range;
          out_range.first  = range.first + group*i;
          out_range.second = range.first + group*(i+1);
          save(out, out_range);
        }

        // re-direct the queues
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);

          std::pair<int, int> from_to;
          while(in)
          {
            load(in, from_to);
            int j = (from_to.second - range.first) / group;

            MemoryBuffer& out = srp.outgoing(srp.out_link().target(j));
            save(out, from_to);
            MemoryBuffer::copy(in, out);
          }
        }
      }
    }